

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFReader.cpp
# Opt level: O3

SymbolInfo * __thiscall
ZXing::Pdf417::ReadSymbolInfo<ZXing::PointT<double>>
          (SymbolInfo *__return_storage_ptr__,Pdf417 *this,
          BitMatrixCursor<ZXing::PointT<double>_> topCur,PointT<double> rowSkip,int colWidth,
          int width,int height)

{
  uint uVar1;
  CodeWord CVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  int local_d8;
  int local_d4;
  _Type local_a8;
  PointT<double> local_98;
  undefined1 local_88 [16];
  PatternView local_78;
  BitMatrixCursor<ZXing::PointT<double>_> local_58;
  
  __return_storage_ptr__->width = colWidth;
  __return_storage_ptr__->height = width;
  uVar8 = 0;
  __return_storage_ptr__->nRows = 0;
  __return_storage_ptr__->lastRow = -1;
  __return_storage_ptr__->rowHeight = 0.0;
  __return_storage_ptr__->colWidth = (int)this;
  dVar10 = topCur.p.x + rowSkip.x * 0.5;
  dVar11 = topCur.p.y + rowSkip.y * 0.5;
  iVar5 = -1;
  iVar7 = 0;
  iVar6 = 0;
  local_88._8_4_ = SUB84(dVar11,0);
  local_88._0_8_ = dVar10;
  local_88._12_4_ = (int)((ulong)dVar11 >> 0x20);
  local_d4 = 0;
  local_d8 = -1;
  local_98 = rowSkip;
  do {
    dVar9 = ABS((double)local_88._8_8_ - dVar11);
    if (ABS((double)local_88._8_8_ - dVar11) <= ABS((double)local_88._0_8_ - dVar10)) {
      dVar9 = ABS((double)local_88._0_8_ - dVar10);
    }
    if ((double)(width / 2) <= dVar9) {
LAB_0017670c:
      __return_storage_ptr__->firstRow = iVar5;
      __return_storage_ptr__->nCols = local_d4;
      __return_storage_ptr__->ecLevel = local_d8;
      if ((~uVar8 & 3) != 0) {
        return __return_storage_ptr__;
      }
      goto LAB_0017672a;
    }
    local_58.img = topCur.img;
    local_58.d.x = topCur.d.x;
    local_58.d.y = topCur.d.y;
    local_58.p.x = dVar10;
    local_58.p.y = dVar11;
    local_a8 = (_Type)BitMatrixCursor<ZXing::PointT<double>>::
                      readPatternFromBlack<std::array<unsigned_short,8ul>>
                                ((BitMatrixCursor<ZXing::PointT<double>> *)&local_58,1,(int)this + 2
                                );
    local_78._data = local_a8;
    local_78._size = 8;
    local_78._base = (Iterator)0x0;
    local_78._end = (Iterator)0x0;
    dVar9 = IsPattern<false,8,17>(&local_78,(FixedPattern<8,_17,_false> *)START_PATTERN,0,0.0,0.0);
    if ((dVar9 == 0.0) && (!NAN(dVar9))) goto LAB_0017670c;
    CVar2 = ReadCodeWord<ZXing::PointT<double>>(&local_58,-1);
    if ((ulong)CVar2 >> 0x20 != 0xffffffff) {
      uVar1 = CVar2.cluster;
      iVar3 = CVar2.code;
      if (iVar5 == -1) {
        iVar5 = (int)uVar1 / 3 + (iVar3 / 0x1e) * 3;
      }
      if (uVar1 == 6) {
        local_d4 = iVar3 % 0x1e + 1;
      }
      else if (uVar1 == 3) {
        iVar6 = iVar3 % 3;
        uVar4 = (char)(((char)(uint)((ulong)((long)iVar3 * 0x88888889) >> 0x24) -
                       (CVar2.code._3_1_ >> 7)) * -0x1e + (char)CVar2.code) * 0x56;
        local_d8 = (int)(char)((char)((uVar4 & 0xffff) >> 0xf) + (char)(uVar4 >> 8));
      }
      else {
        if (uVar1 != 0) goto LAB_001766e5;
        iVar7 = iVar3 % 0x1e;
      }
      uVar8 = uVar8 | 1 << ((uVar1 & 0xff) / 3 & 0x1f);
    }
LAB_001766e5:
    dVar10 = dVar10 + local_98.x;
    dVar11 = dVar11 + local_98.y;
  } while (uVar8 != 7);
  __return_storage_ptr__->firstRow = iVar5;
  __return_storage_ptr__->nCols = local_d4;
  __return_storage_ptr__->ecLevel = local_d8;
LAB_0017672a:
  __return_storage_ptr__->nRows = iVar7 * 3 + iVar6 + 1;
  return __return_storage_ptr__;
}

Assistant:

SymbolInfo ReadSymbolInfo(BitMatrixCursor<POINT> topCur, POINT rowSkip, int colWidth, int width, int height)
{
	SymbolInfo res = {width, height};
	res.colWidth = colWidth;
	int clusterMask = 0;
	int rows0 = 0, rows1 = 0; // Suppress GNUC -Wmaybe-uninitialized

	topCur.p += .5f * rowSkip;

	for (auto startCur = topCur; clusterMask != 0b111 && maxAbsComponent(topCur.p - startCur.p) < height / 2; startCur.p += rowSkip) {
		auto cur = startCur;
		if (!IsPattern(cur.template readPatternFromBlack<Pattern417>(1, colWidth + 2), START_PATTERN))
			break;
		auto cw = ReadCodeWord(cur);
#ifdef PRINT_DEBUG
		printf("%3dx%3d:%2d: %4d.%d \n", int(cur.p.x), int(cur.p.y), Row(cw), cw.code, cw.cluster);
		fflush(stdout);
#endif
		if (!cw)
			continue;
		if (res.firstRow == -1)
			res.firstRow = Row(cw);
		switch (cw.cluster) {
		case 0: rows0 = cw.code % 30; break;
		case 3: rows1 = cw.code % 3, res.ecLevel = (cw.code % 30) / 3; break;
		case 6: res.nCols = (cw.code % 30) + 1; break;
		default: continue;
		}
		clusterMask |= (1 << cw.cluster / 3);
	}
	if ((clusterMask & 0b11) == 0b11)
		res.nRows = 3 * rows0 + rows1 + 1;
	return res;
}